

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprRefToSrcList(Walker *pWalker,Expr *pExpr)

{
  long lVar1;
  RefSrcList *pRVar2;
  SrcList *pSVar3;
  bool bVar4;
  long lVar5;
  ushort uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  if ((pExpr->op == 0xa9) || (pExpr->op == 0xa7)) {
    pRVar2 = (pWalker->u).pRefSrcList;
    pSVar3 = pRVar2->pRef;
    if (pSVar3 == (SrcList *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = pSVar3->nSrc;
    }
    if (0 < (int)uVar7) {
      lVar8 = 0;
      do {
        if (pExpr->iTable == *(int *)((long)&pSVar3->a[0].iCursor + lVar8)) {
          uVar6 = 1;
          goto LAB_0018f59d;
        }
        lVar8 = lVar8 + 0x68;
      } while ((ulong)uVar7 * 0x68 - lVar8 != 0);
    }
    lVar8 = pRVar2->nExclude;
    uVar6 = 2;
    bVar4 = 0 < lVar8;
    if (0 < lVar8) {
      if (*pRVar2->aiExclude != pExpr->iTable) {
        lVar9 = 0;
        do {
          if (lVar8 + -1 == lVar9) goto LAB_0018f59d;
          lVar1 = lVar9 + 1;
          lVar5 = lVar9 + 1;
          lVar9 = lVar1;
        } while (pRVar2->aiExclude[lVar5] != pExpr->iTable);
        bVar4 = lVar1 < lVar8;
      }
      if (bVar4) {
        return 0;
      }
    }
LAB_0018f59d:
    pWalker->eCode = pWalker->eCode | uVar6;
  }
  return 0;
}

Assistant:

static int exprRefToSrcList(Walker *pWalker, Expr *pExpr){
  if( pExpr->op==TK_COLUMN
   || pExpr->op==TK_AGG_COLUMN
  ){
    int i;
    struct RefSrcList *p = pWalker->u.pRefSrcList;
    SrcList *pSrc = p->pRef;
    int nSrc = pSrc ? pSrc->nSrc : 0;
    for(i=0; i<nSrc; i++){
      if( pExpr->iTable==pSrc->a[i].iCursor ){
        pWalker->eCode |= 1;
        return WRC_Continue;
      }
    }
    for(i=0; i<p->nExclude && p->aiExclude[i]!=pExpr->iTable; i++){}
    if( i>=p->nExclude ){
      pWalker->eCode |= 2;
    }
  }
  return WRC_Continue;
}